

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O1

void __thiscall
t_ocaml_generator::generate_ocaml_struct_member
          (t_ocaml_generator *this,ostream *out,string *tname,t_field *tmember)

{
  pointer pcVar1;
  t_const_value *ptVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  ostream *poVar6;
  string mname;
  string x;
  char *local_d0;
  char local_c0 [8];
  undefined8 uStack_b8;
  string local_b0;
  string local_90;
  char *local_70;
  long local_68;
  char local_60 [8];
  undefined8 uStack_58;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"_x","");
  t_generator::tmp(&local_90,(t_generator *)this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pcVar1 = (tmember->name_)._M_dataplus._M_p;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (tmember->name_)._M_string_length);
  pcVar3 = local_70;
  iVar5 = tolower((int)*local_70);
  *pcVar3 = (char)iVar5;
  lVar4 = local_68;
  local_d0 = local_c0;
  if (local_70 == local_60) {
    uStack_b8 = uStack_58;
  }
  else {
    local_d0 = local_70;
  }
  local_68 = 0;
  local_60[0] = '\0';
  local_70 = local_60;
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"val mutable _",0xd);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_d0,lVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," : ",3);
  render_ocaml_type_abi_cxx11_(&local_b0,this,tmember->type_);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  ptVar2 = tmember->value_;
  if (ptVar2 == (t_const_value *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(out," option = None",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(out," = ",3);
    render_const_value_abi_cxx11_(&local_b0,this,tmember->type_,tmember->value_);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  if (tmember->value_ == (t_const_value *)0x0) {
    poVar6 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"method get_",0xb);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_d0,lVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," = _",4);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_d0,lVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar6 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"method grab_",0xc);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_d0,lVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," = match _",10);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_d0,lVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," with None->raise (Field_empty \"",0x20);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(tname->_M_dataplus)._M_p,tname->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,".",1);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_d0,lVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\") | Some ",10);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," -> ",4);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar6 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"method set_",0xb);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_d0,lVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," = _",4);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_d0,lVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," <- Some ",9);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar6 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"method unset_",0xd);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_d0,lVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," = _",4);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_d0,lVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," <- None",8);
  }
  else {
    poVar6 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"method get_",0xb);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_d0,lVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," = Some _",9);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_d0,lVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar6 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"method grab_",0xc);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_d0,lVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," = _",4);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_d0,lVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar6 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"method set_",0xb);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_d0,lVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," = _",4);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_d0,lVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," <- ",4);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_90._M_dataplus._M_p,local_90._M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar6 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"method reset_",0xd);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_d0,lVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," = _",4);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_d0,lVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," <- ",4);
  if (ptVar2 == (t_const_value *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"None",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  else {
    if (tmember->value_ == (t_const_value *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(out,"Some ",5);
      render_const_value_abi_cxx11_(&local_b0,this,tmember->type_,tmember->value_);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    else {
      render_const_value_abi_cxx11_(&local_b0,this,tmember->type_,tmember->value_);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_ocaml_generator::generate_ocaml_struct_member(ostream& out,
                                                     string tname,
                                                     t_field* tmember) {
  string x = tmp("_x");
  string mname = decapitalize(tmember->get_name());

  indent(out) << "val mutable _" << mname << " : " << render_ocaml_type(tmember->get_type());
  t_const_value* val = tmember->get_value();
  if (val) {
    if (struct_member_persistent(tmember))
      out << " = " << render_const_value(tmember->get_type(), tmember->get_value()) << endl;
    else
      out << " option = Some " << render_const_value(tmember->get_type(), tmember->get_value())
          << endl;
  } else {
    // assert(!struct_member_persistent(tmember))
    out << " option = None" << endl;
  }

  if (struct_member_persistent(tmember)) {
    indent(out) << "method get_" << mname << " = Some _" << mname << endl;
    indent(out) << "method grab_" << mname << " = _" << mname << endl;
    indent(out) << "method set_" << mname << " " << x << " = _" << mname << " <- " << x << endl;
  } else {
    indent(out) << "method get_" << mname << " = _" << mname << endl;
    indent(out) << "method grab_" << mname << " = match _" << mname
                << " with None->raise (Field_empty \"" << tname << "." << mname << "\") | Some "
                << x << " -> " << x << endl;
    indent(out) << "method set_" << mname << " " << x << " = _" << mname << " <- Some " << x
                << endl;
    indent(out) << "method unset_" << mname << " = _" << mname << " <- None" << endl;
  }

  indent(out) << "method reset_" << mname << " = _" << mname << " <- ";
  if (val) {
    if (struct_member_persistent(tmember))
      out << render_const_value(tmember->get_type(), tmember->get_value()) << endl;
    else
      out << "Some " << render_const_value(tmember->get_type(), tmember->get_value()) << endl;
  } else {
    out << "None" << endl;
  }
}